

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_cab.c
# Opt level: O3

wchar_t lzx_br_fillup(lzx_stream *strm,lzx_br *br)

{
  ushort *puVar1;
  uchar *puVar2;
  byte *pbVar3;
  wchar_t wVar4;
  wchar_t wVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  
  wVar5 = br->cache_avail;
  iVar6 = 0;
  wVar4 = wVar5;
  do {
    wVar4 = wVar4 + L'\x10';
    iVar7 = (0x40 - wVar5) + iVar6 >> 4;
    if (iVar7 == 3) {
      lVar8 = strm->avail_in;
      if (5 < lVar8) {
        pbVar3 = strm->next_in;
        br->cache_buffer =
             (ulong)pbVar3[4] |
             (ulong)pbVar3[5] << 8 |
             (ulong)pbVar3[2] << 0x10 |
             (ulong)pbVar3[3] << 0x18 |
             (ulong)*pbVar3 << 0x20 | (ulong)pbVar3[1] << 0x28 | br->cache_buffer << 0x30;
        strm->next_in = pbVar3 + 6;
        strm->avail_in = lVar8 + -6;
        wVar5 = (wVar5 - iVar6) + L'0';
LAB_0012d14a:
        br->cache_avail = wVar5;
        return L'\x01';
      }
    }
    else if (iVar7 == 4) {
      lVar8 = strm->avail_in;
      if (7 < lVar8) {
        puVar1 = (ushort *)strm->next_in;
        br->cache_buffer =
             (ulong)(byte)puVar1[3] |
             (ulong)*(byte *)((long)puVar1 + 7) << 8 |
             (ulong)(byte)puVar1[2] << 0x10 |
             (ulong)*(byte *)((long)puVar1 + 5) << 0x18 |
             (ulong)(byte)puVar1[1] << 0x20 |
             (ulong)*(byte *)((long)puVar1 + 3) << 0x28 | (ulong)*puVar1 << 0x30;
        strm->next_in = (uchar *)(puVar1 + 4);
        strm->avail_in = lVar8 + -8;
        wVar5 = (wVar5 - iVar6) + L'@';
        goto LAB_0012d14a;
      }
    }
    else {
      if (iVar7 == 0) {
        return L'\x01';
      }
      lVar8 = strm->avail_in;
    }
    if (lVar8 < 2) {
      if (lVar8 == 1) {
        puVar2 = strm->next_in;
        strm->next_in = puVar2 + 1;
        br->odd = *puVar2;
        strm->avail_in = 0;
        br->have_odd = '\x01';
      }
      return L'\0';
    }
    puVar1 = (ushort *)strm->next_in;
    br->cache_buffer = (ulong)*puVar1 | br->cache_buffer << 0x10;
    strm->next_in = (uchar *)(puVar1 + 1);
    strm->avail_in = lVar8 + -2;
    br->cache_avail = wVar4;
    iVar6 = iVar6 + -0x10;
  } while( true );
}

Assistant:

static int
lzx_br_fillup(struct lzx_stream *strm, struct lzx_br *br)
{
/*
 * x86 proccessor family can read misaligned data without an access error.
 */
	int n = CACHE_BITS - br->cache_avail;

	for (;;) {
		switch (n >> 4) {
		case 4:
			if (strm->avail_in >= 8) {
				br->cache_buffer =
				    ((uint64_t)strm->next_in[1]) << 56 |
				    ((uint64_t)strm->next_in[0]) << 48 |
				    ((uint64_t)strm->next_in[3]) << 40 |
				    ((uint64_t)strm->next_in[2]) << 32 |
				    ((uint32_t)strm->next_in[5]) << 24 |
				    ((uint32_t)strm->next_in[4]) << 16 |
				    ((uint32_t)strm->next_in[7]) << 8 |
				     (uint32_t)strm->next_in[6];
				strm->next_in += 8;
				strm->avail_in -= 8;
				br->cache_avail += 8 * 8;
				return (1);
			}
			break;
		case 3:
			if (strm->avail_in >= 6) {
				br->cache_buffer =
		 		   (br->cache_buffer << 48) |
				    ((uint64_t)strm->next_in[1]) << 40 |
				    ((uint64_t)strm->next_in[0]) << 32 |
				    ((uint32_t)strm->next_in[3]) << 24 |
				    ((uint32_t)strm->next_in[2]) << 16 |
				    ((uint32_t)strm->next_in[5]) << 8 |
				     (uint32_t)strm->next_in[4];
				strm->next_in += 6;
				strm->avail_in -= 6;
				br->cache_avail += 6 * 8;
				return (1);
			}
			break;
		case 0:
			/* We have enough compressed data in
			 * the cache buffer.*/
			return (1);
		default:
			break;
		}
		if (strm->avail_in < 2) {
			/* There is not enough compressed data to
			 * fill up the cache buffer. */
			if (strm->avail_in == 1) {
				br->odd = *strm->next_in++;
				strm->avail_in--;
				br->have_odd = 1;
			}
			return (0);
		}
		br->cache_buffer =
		   (br->cache_buffer << 16) |
		    archive_le16dec(strm->next_in);
		strm->next_in += 2;
		strm->avail_in -= 2;
		br->cache_avail += 16;
		n -= 16;
	}
}